

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool google::protobuf::FileDescriptorProto::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::DescriptorProto> *t;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *t_00;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *t_01;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *t_02;
  uint32_t *puVar2;
  FileDescriptorProto *this_;
  MessageLite *msg_local;
  
  t = _internal_message_type((FileDescriptorProto *)msg);
  bVar1 = internal::AllAreInitialized<google::protobuf::DescriptorProto>(t);
  if (bVar1) {
    t_00 = _internal_enum_type((FileDescriptorProto *)msg);
    bVar1 = internal::AllAreInitialized<google::protobuf::EnumDescriptorProto>(t_00);
    if (bVar1) {
      t_01 = _internal_service((FileDescriptorProto *)msg);
      bVar1 = internal::AllAreInitialized<google::protobuf::ServiceDescriptorProto>(t_01);
      if (bVar1) {
        t_02 = _internal_extension((FileDescriptorProto *)msg);
        bVar1 = internal::AllAreInitialized<google::protobuf::FieldDescriptorProto>(t_02);
        if (bVar1) {
          puVar2 = internal::HasBits<1>::operator[]((HasBits<1> *)(msg + 1),0);
          if (((*puVar2 & 8) == 0) ||
             (bVar1 = FileOptions::IsInitialized((FileOptions *)msg[0xe]._vptr_MessageLite), bVar1))
          {
            puVar2 = internal::HasBits<1>::operator[]((HasBits<1> *)(msg + 1),0);
            if (((*puVar2 & 0x10) == 0) ||
               (bVar1 = SourceCodeInfo::IsInitialized
                                  ((SourceCodeInfo *)msg[0xe]._internal_metadata_.ptr_), bVar1)) {
              msg_local._7_1_ = true;
            }
            else {
              msg_local._7_1_ = false;
            }
          }
          else {
            msg_local._7_1_ = false;
          }
        }
        else {
          msg_local._7_1_ = false;
        }
      }
      else {
        msg_local._7_1_ = false;
      }
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool FileDescriptorProto::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const FileDescriptorProto&>(msg);
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_message_type()))
    return false;
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_enum_type()))
    return false;
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_service()))
    return false;
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_extension()))
    return false;
  if ((this_._impl_._has_bits_[0] & 0x00000008u) != 0) {
    if (!this_._impl_.options_->IsInitialized()) return false;
  }
  if ((this_._impl_._has_bits_[0] & 0x00000010u) != 0) {
    if (!this_._impl_.source_code_info_->IsInitialized()) return false;
  }
  return true;
}